

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::AddOperandsToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *inst_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:542:21)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:542:21)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Instruction::ForEachInId(inst,(function<void_(const_unsigned_int_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  uVar1 = Instruction::type_id(inst);
  if (uVar1 != 0) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    uVar1 = Instruction::type_id(inst);
    inst_00 = analysis::DefUseManager::GetDef(this_00,uVar1);
    AddToWorklist(this,inst_00);
  }
  return;
}

Assistant:

void AggressiveDCEPass::AddOperandsToWorkList(const Instruction* inst) {
  inst->ForEachInId([this](const uint32_t* iid) {
    Instruction* inInst = get_def_use_mgr()->GetDef(*iid);
    AddToWorklist(inInst);
  });
  if (inst->type_id() != 0) {
    AddToWorklist(get_def_use_mgr()->GetDef(inst->type_id()));
  }
}